

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int64_helper.c
# Opt level: O0

void sparc_cpu_do_interrupt_sparc64(CPUState *cs)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  CPUSPARCState_conflict1 *env_00;
  trap_state *ptVar4;
  target_ulong tVar5;
  target_ulong tVar6;
  trap_state *tsptr;
  int intno;
  CPUSPARCState_conflict1 *env;
  SPARCCPU_conflict1 *cpu;
  CPUState *cs_local;
  
  env_00 = (CPUSPARCState_conflict1 *)(cs[1].tb_jmp_cache + 0x1f5);
  uVar1 = cs->exception_index;
  if (*(int *)(cs[1].tb_jmp_cache + 0x204) != 1) {
    cpu_get_psr_sparc64((CPUSPARCState_conflict2 *)env_00);
  }
  if (*(uint *)((long)cs[1].tb_jmp_cache + 0x2bf4) < *(uint *)(cs[1].tb_jmp_cache + 0x57f)) {
    if (*(uint *)((long)cs[1].tb_jmp_cache + 0x2bf4) < *(int *)(cs[1].tb_jmp_cache + 0x57f) - 1U) {
      *(int *)((long)cs[1].tb_jmp_cache + 0x2bf4) = *(int *)((long)cs[1].tb_jmp_cache + 0x2bf4) + 1;
    }
    else {
      *(uint *)(cs[1].tb_jmp_cache + 0x57e) = *(uint *)(cs[1].tb_jmp_cache + 0x57e) | 0x20;
      if (*(uint *)((long)cs[1].tb_jmp_cache + 0x2bf4) < *(uint *)(cs[1].tb_jmp_cache + 0x57f)) {
        *(int *)((long)cs[1].tb_jmp_cache + 0x2bf4) =
             *(int *)((long)cs[1].tb_jmp_cache + 0x2bf4) + 1;
      }
    }
    ptVar4 = cpu_tsptr_sparc64(env_00);
    tVar5 = cpu_get_ccr_sparc64((CPUSPARCState_conflict2 *)env_00);
    iVar2 = *(int *)((long)cs[1].tb_jmp_cache + 0x2bec);
    uVar3 = *(uint *)(cs[1].tb_jmp_cache + 0x57e);
    tVar6 = cpu_get_cwp64_sparc64((CPUSPARCState_conflict2 *)env_00);
    ptVar4->tstate =
         tVar5 << 0x20 | (ulong)(uint)(iVar2 << 0x18) | (ulong)((uVar3 & 0xf3f) << 8) | tVar6;
    ptVar4->tpc = (uint64_t)cs[1].tb_jmp_cache[0x1fe];
    ptVar4->tnpc = (uint64_t)cs[1].tb_jmp_cache[0x1ff];
    ptVar4->tt = uVar1;
    iVar2 = cpu_has_hypervisor(env_00);
    if ((iVar2 != 0) &&
       (cs[1].tb_jmp_cache[(ulong)*(uint *)((long)cs[1].tb_jmp_cache + 0x2bf4) + 0x5ea] =
             cs[1].tb_jmp_cache[0x5e9], 2 < *(uint *)((long)cs[1].tb_jmp_cache + 0x2bf4))) {
      cs[1].tb_jmp_cache[0x5e9] = (TranslationBlock *)((ulong)cs[1].tb_jmp_cache[0x5e9] | 4);
    }
    if (((ulong)cs[1].tb_jmp_cache[0x60b] & 0x2000) != 0) {
      ptVar4->tstate = ((ulong)*(uint *)(cs[1].tb_jmp_cache + 0x5e8) & 7) << 0x28 | ptVar4->tstate;
      cpu_gl_switch_gregs_sparc64
                ((CPUSPARCState_conflict2 *)env_00,*(int *)(cs[1].tb_jmp_cache + 0x5e8) + 1);
      *(int *)(cs[1].tb_jmp_cache + 0x5e8) = *(int *)(cs[1].tb_jmp_cache + 0x5e8) + 1;
    }
    switch(uVar1) {
    case 8:
    case 0x30:
    case 100:
    case 0x65:
    case 0x66:
    case 0x67:
    case 0x68:
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6d:
    case 0x6e:
    case 0x6f:
      iVar2 = cpu_has_hypervisor(env_00);
      if (iVar2 == 0) {
        cpu_change_pstate_sparc64((CPUSPARCState_conflict2 *)env_00,0x414);
      }
      else {
        cs[1].tb_jmp_cache[0x5e9] = (TranslationBlock *)((ulong)cs[1].tb_jmp_cache[0x5e9] | 4);
        *(undefined4 *)(cs[1].tb_jmp_cache + 0x57e) = 0x14;
      }
      break;
    default:
      if (((int)uVar1 < 0x3e) || (0x3f < (int)uVar1)) {
        if (((int)uVar1 < 0x180) || (0x1ff < (int)uVar1)) {
          cpu_change_pstate_sparc64((CPUSPARCState_conflict2 *)env_00,0x15);
        }
        else {
          cs[1].tb_jmp_cache[0x5e9] = (TranslationBlock *)((ulong)cs[1].tb_jmp_cache[0x5e9] | 4);
        }
      }
      else {
        cs[1].tb_jmp_cache[0x5e9] = (TranslationBlock *)((ulong)cs[1].tb_jmp_cache[0x5e9] | 4);
      }
      break;
    case 0x60:
      iVar2 = cpu_has_hypervisor(env_00);
      if (iVar2 == 0) {
        cpu_change_pstate_sparc64((CPUSPARCState_conflict2 *)env_00,0x814);
      }
    }
    if (uVar1 == 0x24) {
      iVar2 = cpu_cwp_dec_sparc64((CPUSPARCState_conflict2 *)env_00,
                                  *(int *)(cs[1].tb_jmp_cache + 0x228) + -1);
      cpu_set_cwp_sparc64((CPUSPARCState_conflict2 *)env_00,iVar2);
    }
    else if ((uVar1 & 0x1c0) == 0x80) {
      iVar2 = cpu_cwp_dec_sparc64((CPUSPARCState_conflict2 *)env_00,
                                  (*(int *)(cs[1].tb_jmp_cache + 0x228) -
                                  *(int *)((long)cs[1].tb_jmp_cache + 0x2bfc)) + -2);
      cpu_set_cwp_sparc64((CPUSPARCState_conflict2 *)env_00,iVar2);
    }
    else if ((uVar1 & 0x1c0) == 0xc0) {
      iVar2 = cpu_cwp_inc_sparc64((CPUSPARCState_conflict2 *)env_00,
                                  *(int *)(cs[1].tb_jmp_cache + 0x228) + 1);
      cpu_set_cwp_sparc64((CPUSPARCState_conflict2 *)env_00,iVar2);
    }
    iVar2 = cpu_hypervisor_mode(env_00);
    if (iVar2 == 0) {
      cs[1].tb_jmp_cache[0x1fe] =
           (TranslationBlock *)((ulong)cs[1].tb_jmp_cache[0x229] & 0xffffffffffff8000);
      uVar3 = 0;
      if (1 < *(uint *)((long)cs[1].tb_jmp_cache + 0x2bf4)) {
        uVar3 = 0x4000;
      }
      cs[1].tb_jmp_cache[0x1fe] =
           (TranslationBlock *)((long)(int)(uVar3 | uVar1 << 5) | (ulong)cs[1].tb_jmp_cache[0x1fe]);
    }
    else {
      cs[1].tb_jmp_cache[0x1fe] =
           (TranslationBlock *)
           ((ulong)cs[1].tb_jmp_cache[0x5f3] & 0xffffffffffffc000 | (long)(int)(uVar1 << 5));
    }
    cs[1].tb_jmp_cache[0x1ff] = (TranslationBlock *)((long)&cs[1].tb_jmp_cache[0x1fe]->pc + 4);
    cs->exception_index = -1;
    return;
  }
  cpu_abort_sparc64(cs,"Trap 0x%04x while trap level (%d) >= MAXTL (%d), Error state",
                    (ulong)(uint)cs->exception_index,
                    (ulong)*(uint *)((long)cs[1].tb_jmp_cache + 0x2bf4),
                    (ulong)*(uint *)(cs[1].tb_jmp_cache + 0x57f));
}

Assistant:

void sparc_cpu_do_interrupt(CPUState *cs)
{
    SPARCCPU *cpu = SPARC_CPU(cs);
    CPUSPARCState *env = &cpu->env;
    int intno = cs->exception_index;
    trap_state *tsptr;

    /* Compute PSR before exposing state.  */
    if (env->cc_op != CC_OP_FLAGS) {
        cpu_get_psr(env);
    }

    if (env->tl >= env->maxtl) {
        cpu_abort(cs, "Trap 0x%04x while trap level (%d) >= MAXTL (%d),"
                  " Error state", cs->exception_index, env->tl, env->maxtl);
        return;
    }
    if (env->tl < env->maxtl - 1) {
        env->tl++;
    } else {
        env->pstate |= PS_RED;
        if (env->tl < env->maxtl) {
            env->tl++;
        }
    }
    tsptr = cpu_tsptr(env);

    tsptr->tstate = (cpu_get_ccr(env) << 32) |
        ((env->asi & 0xff) << 24) | ((env->pstate & 0xf3f) << 8) |
        cpu_get_cwp64(env);
    tsptr->tpc = env->pc;
    tsptr->tnpc = env->npc;
    tsptr->tt = intno;

    if (cpu_has_hypervisor(env)) {
        env->htstate[env->tl] = env->hpstate;
        /* XXX OpenSPARC T1 - UltraSPARC T3 have MAXPTL=2
           but this may change in the future */
        if (env->tl > 2) {
            env->hpstate |= HS_PRIV;
        }
    }

    if (env->def.features & CPU_FEATURE_GL) {
        tsptr->tstate |= (env->gl & 7ULL) << 40;
        cpu_gl_switch_gregs(env, env->gl + 1);
        env->gl++;
    }

    switch (intno) {
    case TT_IVEC:
        if (!cpu_has_hypervisor(env)) {
            cpu_change_pstate(env, PS_PEF | PS_PRIV | PS_IG);
        }
        break;
    case TT_TFAULT:
    case TT_DFAULT:
    case TT_TMISS:
    case TT_TMISS + 1:
    case TT_TMISS + 2:
    case TT_TMISS + 3:

    case TT_DMISS:
    case TT_DMISS + 1:
    case TT_DMISS + 2:
    case TT_DMISS + 3:

    case TT_DPROT:
    case TT_DPROT + 1:
    case TT_DPROT + 2:
    case TT_DPROT + 3:

        if (cpu_has_hypervisor(env)) {
            env->hpstate |= HS_PRIV;
            env->pstate = PS_PEF | PS_PRIV;
        } else {
            cpu_change_pstate(env, PS_PEF | PS_PRIV | PS_MG);
        }
        break;
    // case TT_INSN_REAL_TRANSLATION_MISS ... TT_DATA_REAL_TRANSLATION_MISS:
    // case TT_HTRAP ... TT_HTRAP + 127:
    //     env->hpstate |= HS_PRIV;
    //     break;
    default:
        if (intno >= TT_INSN_REAL_TRANSLATION_MISS && intno <= TT_DATA_REAL_TRANSLATION_MISS) {
            env->hpstate |= HS_PRIV;
            break;
        }
        if (intno >= TT_HTRAP && intno <= TT_HTRAP + 127) {
            env->hpstate |= HS_PRIV;
            break;
        }
        cpu_change_pstate(env, PS_PEF | PS_PRIV | PS_AG);
        break;
    }

    if (intno == TT_CLRWIN) {
        cpu_set_cwp(env, cpu_cwp_dec(env, env->cwp - 1));
    } else if ((intno & 0x1c0) == TT_SPILL) {
        cpu_set_cwp(env, cpu_cwp_dec(env, env->cwp - env->cansave - 2));
    } else if ((intno & 0x1c0) == TT_FILL) {
        cpu_set_cwp(env, cpu_cwp_inc(env, env->cwp + 1));
    }

    if (cpu_hypervisor_mode(env)) {
        env->pc = (env->htba & ~0x3fffULL) | (intno << 5);
    } else {
        env->pc = env->tbr  & ~0x7fffULL;
        env->pc |= ((env->tl > 1) ? 1 << 14 : 0) | (intno << 5);
    }
    env->npc = env->pc + 4;
    cs->exception_index = -1;
}